

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O3

aiString * ReadString(aiString *__return_storage_ptr__,StreamReaderLE *stream,uint32_t numWChars)

{
  uint uVar1;
  pointer puVar2;
  undefined1 *puVar3;
  unsigned_short uVar4;
  aiString *paVar5;
  unsigned_short *start;
  size_t sVar6;
  aiString *extraout_RAX;
  aiString *extraout_RAX_00;
  pointer puVar7;
  ulong uVar8;
  uint32_t n;
  ulong uVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  
  if (stream == (StreamReaderLE *)0x0 || numWChars == 0) {
    if (ReadString(Assimp::StreamReader<false,false>*,unsigned_int)::empty == '\0') {
      ReadString();
    }
    uVar1 = 0x3ff;
    if (ReadString::empty.length < 0x3ff) {
      uVar1 = ReadString::empty.length;
    }
    __return_storage_ptr__->length = uVar1;
    paVar5 = (aiString *)memcpy(__return_storage_ptr__->data,ReadString::empty.data,(ulong)uVar1);
    __return_storage_ptr__->data[uVar1] = '\0';
  }
  else {
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_68,(ulong)(numWChars * 4 + 1));
    uVar8 = (ulong)numWChars;
    start = (unsigned_short *)operator_new__(uVar8 * 2);
    uVar9 = 0;
    do {
      uVar4 = Assimp::StreamReader<false,_false>::Get<unsigned_short>(stream);
      start[uVar9] = uVar4;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
    utf8::
    utf16to8<unsigned_short_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (start,start + uVar8,&local_68);
    puVar2 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = '\0';
    local_48 = local_38;
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      puVar7 = (pointer)0x1;
    }
    else {
      sVar6 = strlen((char *)local_68.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      puVar7 = puVar2 + sVar6;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,puVar2,puVar7);
    puVar3 = local_48;
    sVar6 = 0x3ff;
    if ((local_40 & 0xfffffc00) == 0) {
      sVar6 = local_40 & 0xffffffff;
    }
    __return_storage_ptr__->length = (ai_uint32)sVar6;
    memcpy(__return_storage_ptr__->data,local_48,sVar6);
    __return_storage_ptr__->data[sVar6] = '\0';
    if (puVar3 != local_38) {
      operator_delete(puVar3);
    }
    operator_delete__(start);
    paVar5 = extraout_RAX;
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      paVar5 = extraout_RAX_00;
    }
  }
  return paVar5;
}

Assistant:

static aiString ReadString(StreamReaderLE *stream, uint32_t numWChars) {
    if ( nullptr == stream || 0 == numWChars ) {
        static const aiString empty;
        return empty;
    }

    // Allocate buffers (max expansion is 1 byte -> 4 bytes for UTF-8)
    std::vector<unsigned char> str;
    str.reserve( numWChars * 4 + 1 );
    uint16_t *temp = new uint16_t[ numWChars ];
    for ( uint32_t n = 0; n < numWChars; ++n ) {
        temp[ n ] = stream->GetU2();
    }

    // Convert it and NUL-terminate.
    const uint16_t *start( temp ), *end( temp + numWChars );
    utf8::utf16to8( start, end, back_inserter( str ) );
    str[ str.size() - 1 ] = '\0';

    // Return the final string.
    aiString result = aiString((const char *)&str[0]);
    delete[] temp;

    return result;
}